

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpreadsheetMode.cpp
# Opt level: O3

void __thiscall KDReports::Test::testFontScaling(Test *this)

{
  Data *pDVar1;
  QRect *pQVar2;
  qsizetype qVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  AutoTableElement *pAVar9;
  reference pQVar10;
  QFont *pQVar11;
  QStandardItemModel *pQVar12;
  uint uVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  Report report;
  AutoTableElement tableElement;
  QArrayDataPointer<QRect> local_d8;
  QArrayDataPointer<char16_t> local_c0;
  QArrayDataPointer<char16_t> local_a8;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_68;
  QByteArrayView local_40;
  char *local_30;
  
  if (fontFound) {
    fillModel(this,2,0x19,false);
    KDReports::Report::Report((Report *)&local_c0,(QObject *)0x0);
    KDReports::Report::setReportMode((ReportMode)&local_c0);
    local_d8.d = (Data *)0x0;
    local_d8.ptr = (QRect *)0x0;
    local_d8.size = 0;
    QByteArrayView::QByteArrayView<char,_true>((QByteArrayView *)&local_a8,"Noto Sans",9);
    QVar14.m_data = (storage_type *)local_a8.d;
    QVar14.m_size = (qsizetype)&local_68;
    QString::fromLatin1(QVar14);
    qVar3 = local_d8.size;
    pQVar2 = local_d8.ptr;
    pDVar1 = local_d8.d;
    local_d8.d = (Data *)local_68.d;
    local_d8.ptr = (QRect *)local_68.ptr;
    local_68.d = (Data *)pDVar1;
    local_68.ptr = (char16_t *)pQVar2;
    local_d8.size = local_68.size;
    local_68.size = qVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    QFont::QFont((QFont *)&local_88,(QString *)&local_d8,0x18,-1,false);
    KDReports::Report::setDefaultFont((QFont *)&local_c0);
    QFont::~QFont((QFont *)&local_88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_d8);
    pQVar12 = &this->m_model;
    KDReports::AutoTableElement::AutoTableElement
              ((AutoTableElement *)&local_68,(QAbstractItemModel *)pQVar12);
    KDReports::AutoTableElement::setHorizontalHeaderVisible(SUB81(&local_68,0));
    KDReports::AutoTableElement::setVerticalHeaderVisible(SUB81(&local_68,0));
    pAVar9 = (AutoTableElement *)KDReports::Report::mainTable();
    KDReports::MainTable::setAutoTableElement(pAVar9);
    iVar8 = KDReports::Report::numberOfPages();
    cVar6 = QTest::qCompare(iVar8,2,"report.numberOfPages()","2",
                            "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                            ,0x54);
    if (cVar6 != '\0') {
      KDReports::Report::mainTable();
      KDReports::MainTable::pageRects();
      cVar6 = QTest::qCompare(local_d8.size,2,"report.mainTable()->pageRects().count()","2",
                              "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                              ,0x55);
      QArrayDataPointer<QRect>::~QArrayDataPointer(&local_d8);
      if (cVar6 != '\0') {
        KDReports::Report::mainTable();
        KDReports::MainTable::pageRects();
        pQVar10 = QList<QRect>::operator[]((QList<QRect> *)&local_d8,0);
        iVar8 = pQVar10->y2 - pQVar10->y1;
        QArrayDataPointer<QRect>::~QArrayDataPointer(&local_d8);
        KDReports::Report::mainTable();
        KDReports::MainTable::pageRects();
        pQVar10 = QList<QRect>::operator[]((QList<QRect> *)&local_d8,0);
        uVar13 = iVar8 + 1;
        local_a8.d = (Data *)0x0;
        local_a8.ptr = (char16_t *)CONCAT44(iVar8,1);
        bVar7 = QTest::qCompare<QRect,QRect>
                          (pQVar10,(QRect *)&local_a8,"report.mainTable()->pageRects()[0]",
                           "QRect(0, 0, 2, rowsFirstPage)",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                           ,0x59);
        QArrayDataPointer<QRect>::~QArrayDataPointer(&local_d8);
        if (bVar7) {
          KDReports::Report::mainTable();
          KDReports::MainTable::pageRects();
          pQVar10 = QList<QRect>::operator[]((QList<QRect> *)&local_d8,1);
          local_a8.d = (Data *)0xffffffffffffffff;
          local_a8.ptr = (char16_t *)0x0;
          local_a8.size = 0;
          iVar8 = QStandardItemModel::rowCount((QModelIndex *)pQVar12);
          local_88.d = (Data *)((ulong)uVar13 << 0x20);
          local_88.ptr = (char16_t *)CONCAT44(iVar8 + -1,1);
          bVar7 = QTest::qCompare<QRect,QRect>
                            (pQVar10,(QRect *)&local_88,"report.mainTable()->pageRects()[1]",
                             "QRect(0, rowsFirstPage, 2, m_model.rowCount() - rowsFirstPage)",
                             "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                             ,0x5a);
          QArrayDataPointer<QRect>::~QArrayDataPointer(&local_d8);
          if (bVar7) {
            KDReports::AutoTableElement::setHorizontalHeaderVisible(SUB81(&local_68,0));
            pAVar9 = (AutoTableElement *)KDReports::Report::mainTable();
            KDReports::MainTable::setAutoTableElement(pAVar9);
            pQVar11 = (QFont *)KDReports::Report::mainTable();
            local_a8.d = (Data *)0x0;
            local_a8.ptr = (char16_t *)0x0;
            local_a8.size = 0;
            QByteArrayView::QByteArrayView<char,_true>((QByteArrayView *)&local_88,"Noto Sans",9);
            QVar15.m_data = (storage_type *)local_88.d;
            QVar15.m_size = (qsizetype)&local_d8;
            QString::fromLatin1(QVar15);
            qVar3 = local_a8.size;
            pcVar5 = local_a8.ptr;
            pDVar4 = local_a8.d;
            local_a8.d = (Data *)local_d8.d;
            local_a8.ptr = (char16_t *)local_d8.ptr;
            local_d8.d = (Data *)pDVar4;
            local_d8.ptr = (QRect *)pcVar5;
            local_a8.size = local_d8.size;
            local_d8.size = qVar3;
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_d8);
            QFont::QFont((QFont *)&local_40,(QString *)&local_a8,0x30,-1,false);
            KDReports::MainTable::setHorizontalHeaderFont(pQVar11);
            QFont::~QFont((QFont *)&local_40);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
            iVar8 = KDReports::Report::numberOfPages();
            cVar6 = QTest::qCompare(iVar8,2,"report.numberOfPages()","2",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                    ,0x60);
            if (cVar6 != '\0') {
              KDReports::Report::mainTable();
              KDReports::MainTable::pageRects();
              pQVar10 = QList<QRect>::operator[]((QList<QRect> *)&local_d8,0);
              cVar6 = QTest::qVerify((pQVar10->y2 - pQVar10->y1) + 1 < (int)uVar13,
                                     "report.mainTable()->pageRects()[0].height() < rowsFirstPage",
                                     "",
                                     "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                     ,0x61);
              QArrayDataPointer<QRect>::~QArrayDataPointer(&local_d8);
              if (cVar6 != '\0') {
                KDReports::Report::setFontScalingFactor(0.2);
                iVar8 = KDReports::Report::numberOfPages();
                cVar6 = QTest::qCompare(iVar8,1,"report.numberOfPages()","1",
                                        "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                        ,0x65);
                if (cVar6 != '\0') {
                  KDReports::Report::mainTable();
                  local_d8.d = (Data *)KDReports::MainTable::lastAutoFontScalingFactor();
                  local_a8.d = (Data *)0x3fc999999999999a;
                  cVar6 = QTest::qCompare((double *)&local_d8,(double *)&local_a8,
                                          "report.mainTable()->lastAutoFontScalingFactor()","0.2",
                                          "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                          ,0x66);
                  if (cVar6 != '\0') {
                    KDReports::Report::mainTable();
                    KDReports::MainTable::pageRects();
                    pQVar10 = QList<QRect>::operator[]((QList<QRect> *)&local_d8,0);
                    local_a8.d = (Data *)0xffffffffffffffff;
                    local_a8.ptr = (char16_t *)0x0;
                    local_a8.size = 0;
                    iVar8 = QStandardItemModel::rowCount((QModelIndex *)pQVar12);
                    local_88.d = (Data *)0x0;
                    local_88.ptr = (char16_t *)CONCAT44(iVar8 + -1,1);
                    QTest::qCompare<QRect,QRect>
                              (pQVar10,(QRect *)&local_88,"report.mainTable()->pageRects()[0]",
                               "QRect(0, 0, 2, m_model.rowCount())",
                               "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                               ,0x67);
                    QArrayDataPointer<QRect>::~QArrayDataPointer(&local_d8);
                  }
                }
              }
            }
          }
        }
      }
    }
    KDReports::AutoTableElement::~AutoTableElement((AutoTableElement *)&local_68);
    KDReports::Report::~Report((Report *)&local_c0);
  }
  else {
    local_40.m_size = 0x10c8fb;
    QByteArrayView::QByteArrayView<const_char_*,_true>
              ((QByteArrayView *)&local_88,(char **)&local_40);
    QVar16.m_data = (storage_type *)local_88.d;
    QVar16.m_size = (qsizetype)&local_68;
    QString::fromUtf8(QVar16);
    local_a8.ptr = local_68.ptr;
    local_a8.d = local_68.d;
    local_68.d = (Data *)0x0;
    local_68.ptr = (char16_t *)0x0;
    local_a8.size = local_68.size;
    local_68.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    local_30 = "Noto Sans";
    QByteArrayView::QByteArrayView<const_char_*,_true>(&local_40,&local_30);
    QVar17.m_data = (storage_type *)local_40.m_size;
    QVar17.m_size = (qsizetype)&local_68;
    QString::fromUtf8(QVar17);
    local_88.ptr = local_68.ptr;
    local_88.d = local_68.d;
    local_68.d = (Data *)0x0;
    local_68.ptr = (char16_t *)0x0;
    local_88.size = local_68.size;
    local_68.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    QString::arg((QString *)&local_c0,(int)&local_a8,(QChar)(char16_t)&local_88);
    QString::toLatin1_helper_inplace((QString *)&local_d8);
    if (local_d8.ptr == (QRect *)0x0) {
      local_d8.ptr = (QRect *)&QByteArray::_empty;
    }
    QTest::qSkip((char *)local_d8.ptr,
                 "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                 ,0x4a);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_d8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  }
  return;
}

Assistant:

void testFontScaling()
    {
        SKIP_IF_FONT_NOT_FOUND

        fillModel(2, 25);
        Report report;
        report.setReportMode(Report::SpreadSheet);
        report.setDefaultFont(QFont(QLatin1String(s_fontName), 24));
        AutoTableElement tableElement(&m_model);
        tableElement.setHorizontalHeaderVisible(false);
        tableElement.setVerticalHeaderVisible(false);
        report.mainTable()->setAutoTableElement(tableElement);
        QCOMPARE(report.numberOfPages(), 2);
        QCOMPARE(report.mainTable()->pageRects().count(), 2);

#ifndef Q_OS_MAC // Somehow the mac gets different font size for the headers, even compared to linux with DPI 72.
        const int rowsFirstPage = report.mainTable()->pageRects()[0].height();
        QCOMPARE(report.mainTable()->pageRects()[0], QRect(0, 0, 2, rowsFirstPage));
        QCOMPARE(report.mainTable()->pageRects()[1], QRect(0, rowsFirstPage, 2, m_model.rowCount() - rowsFirstPage));

        // Now show a huge horizontal header, and check we have less rows per page
        tableElement.setHorizontalHeaderVisible(true);
        report.mainTable()->setAutoTableElement(tableElement);
        report.mainTable()->setHorizontalHeaderFont(QFont(QLatin1String(s_fontName), 48));
        QCOMPARE(report.numberOfPages(), 2);
        QVERIFY(report.mainTable()->pageRects()[0].height() < rowsFirstPage);

        // Now force a very small font scaling factor
        report.setFontScalingFactor(0.2);
        QCOMPARE(report.numberOfPages(), 1);
        QCOMPARE(report.mainTable()->lastAutoFontScalingFactor(), 0.2);
        QCOMPARE(report.mainTable()->pageRects()[0], QRect(0, 0, 2, m_model.rowCount()));
#endif
    }